

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

int __thiscall ON_wString::Count(ON_wString *this,wchar_t ch)

{
  int iVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  
  pwVar2 = this->m_s;
  wVar3 = *pwVar2;
  if (wVar3 != L'\0') {
    iVar1 = 0;
    do {
      pwVar2 = pwVar2 + 1;
      iVar1 = iVar1 + (uint)(wVar3 == ch);
      wVar3 = *pwVar2;
    } while (wVar3 != L'\0');
    return iVar1;
  }
  return 0;
}

Assistant:

int ON_wString::Count(wchar_t ch) const
{
  int count = 0;

  const wchar_t* p = m_s;
  while (*p != 0)
  {
    if (*p++ == ch)
      count++;
  }

  return count;
}